

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_free(ggml_context *ctx)

{
  int iVar1;
  long lVar2;
  
  while( true ) {
    LOCK();
    iVar1 = g_state_barrier + 1;
    UNLOCK();
    if (g_state_barrier < 1) break;
    LOCK();
    UNLOCK();
    sched_yield();
  }
  lVar2 = 0;
  do {
    g_state_barrier = iVar1;
    if ((ggml_context *)((long)&g_state.contexts[0].context.mem_size + lVar2) == ctx) {
      (&g_state.contexts[0].used)[lVar2] = false;
      if (ctx->mem_buffer_owned == true) {
        free(ctx->mem_buffer);
      }
      break;
    }
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x1800);
  LOCK();
  g_state_barrier = g_state_barrier + -1;
  UNLOCK();
  return;
}

Assistant:

void ggml_free(struct ggml_context * ctx) {
    // make this function thread safe
    ggml_critical_section_start();

    bool found = false;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (&g_state.contexts[i].context == ctx) {
            g_state.contexts[i].used = false;

            GGML_PRINT_DEBUG("%s: context %d with %d objects has been freed. memory used = %zu\n",
                    __func__, i, ctx->n_objects, ctx->objects_end->offs + ctx->objects_end->size);

            if (ctx->mem_buffer_owned) {
                free(ctx->mem_buffer);
            }

            found = true;
            break;
        }
    }

    if (!found) {
        GGML_PRINT_DEBUG("%s: context not found\n", __func__);
    }

    ggml_critical_section_end();
}